

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O3

void __thiscall
solitaire::events::EventsProcessor::processButtonsHoverState(EventsProcessor *this,MouseMove *event)

{
  undefined1 uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 extraout_RDX;
  long *plVar3;
  
  iVar2 = (*this->context->_vptr_Context[0xc])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  uVar1 = (**(code **)(*plVar3 + 0x18))(plVar3,event);
  (**(code **)(*plVar3 + 0x10))(plVar3,uVar1);
  iVar2 = (*this->context->_vptr_Context[0xe])();
  plVar3 = (long *)CONCAT44(extraout_var_00,iVar2);
  uVar1 = (**(code **)(*plVar3 + 0x18))(plVar3,event);
  (**(code **)(*plVar3 + 0x10))(plVar3,uVar1,extraout_RDX,*(code **)(*plVar3 + 0x10));
  return;
}

Assistant:

void EventsProcessor::processButtonsHoverState(const MouseMove& event) const {
    auto& newGameButton = context.getNewGameButton();
    newGameButton.setHoveredState(
        newGameButton.collidesWith(event.position));
    auto& undoButton = context.getUndoButton();
    undoButton.setHoveredState(
        undoButton.collidesWith(event.position));
}